

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

void llama_kv_cache_view_update(llama_kv_cache_view *view,llama_kv_cache *kv)

{
  bool bVar1;
  _Rb_tree_const_iterator<int> *this;
  const_reference pvVar2;
  reference piVar3;
  size_type sVar4;
  long in_RSI;
  uint *in_RDI;
  llama_seq_id it;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  int seq_idx;
  size_t curr_size;
  int32_t i;
  int32_t max_contig_idx;
  uint32_t max_contig;
  int32_t curr_contig_idx;
  int32_t token_count;
  int32_t used_cells;
  llama_seq_id *cs_curr;
  llama_kv_cache_view_cell *c_curr;
  vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *kv_cells;
  void *p;
  llama_kv_cache_unified *kvu;
  undefined4 in_stack_ffffffffffffff68;
  llama_pos lVar5;
  _Self local_78;
  _Self local_70;
  set<int,_std::less<int>,_std::allocator<int>_> *local_68;
  int local_5c;
  size_type local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  int *local_30;
  vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *local_28;
  void *local_20;
  _Rb_tree_const_iterator<int> *local_18;
  uint *local_8;
  
  local_8 = in_RDI;
  if (in_RSI == 0) {
    this = (_Rb_tree_const_iterator<int> *)0x0;
  }
  else {
    this = (_Rb_tree_const_iterator<int> *)
           __dynamic_cast(in_RSI,&llama_kv_cache::typeinfo,&llama_kv_cache_unified::typeinfo,0);
  }
  local_18 = this;
  if (this == (_Rb_tree_const_iterator<int> *)0x0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: the kv_cache_view currently works only with llama_kv_cache_unified\n",
                       "llama_kv_cache_view_update");
  }
  else {
    if ((*local_8 < *(uint *)((long)&this[0xd]._M_node + 4)) || (*(long *)(local_8 + 6) == 0)) {
      *local_8 = *(uint *)((long)&this[0xd]._M_node + 4);
      local_20 = realloc(*(void **)(local_8 + 6),(long)(int)*local_8 << 2);
      if (local_20 == (void *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x52a,"GGML_ASSERT(%s) failed",
                   "p != nullptr && \"Failed to alloc kv_cache_view cells\"");
      }
      *(void **)(local_8 + 6) = local_20;
      local_20 = realloc(*(void **)(local_8 + 8),(long)(int)local_8[1] * 4 * (long)(int)*local_8);
      if (local_20 == (void *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x52d,"GGML_ASSERT(%s) failed",
                   "p != nullptr && \"Failed to alloc kv_cache_view cells sequences\"");
      }
      *(void **)(local_8 + 8) = local_20;
    }
    local_28 = (vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(local_18 + 0xf);
    local_30 = *(int **)(local_8 + 6);
    local_38 = *(long *)(local_8 + 8);
    local_3c = 0;
    local_40 = 0;
    local_44 = 0xffffffff;
    local_48 = 0;
    local_4c = 0xffffffff;
    for (local_50 = 0; (int)local_50 < *(int *)((long)&local_18[0xd]._M_node + 4);
        local_50 = local_50 + 1) {
      std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                (local_28,(long)(int)local_50);
      local_58 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)0x444f5d);
      local_40 = local_40 + (int)local_58;
      pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         (local_28,(long)(int)local_50);
      lVar5 = pvVar2->pos;
      pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         (local_28,(long)(int)local_50);
      *local_30 = lVar5 + pvVar2->delta;
      if (local_58 == 0) {
        if ((int)local_44 < 0) {
          local_44 = local_50;
        }
      }
      else {
        if ((-1 < (int)local_44) && (local_48 < local_50 - local_44)) {
          local_48 = local_50 - local_44;
          local_4c = local_44;
        }
        local_44 = 0xffffffff;
      }
      local_5c = 0;
      pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         (local_28,(long)(int)local_50);
      local_68 = &pvVar2->seq_id;
      local_70._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(lVar5,in_stack_ffffffffffffff68));
      local_78._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(lVar5,in_stack_ffffffffffffff68));
      while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
        piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x44504e);
        if ((int)local_8[1] <= local_5c) break;
        *(int *)(local_38 + (long)local_5c * 4) = *piVar3;
        local_5c = local_5c + 1;
        std::_Rb_tree_const_iterator<int>::operator++(this);
      }
      if (local_5c != 0) {
        local_3c = local_3c + 1;
      }
      for (; local_5c < (int)local_8[1]; local_5c = local_5c + 1) {
        *(undefined4 *)(local_38 + (long)local_5c * 4) = 0xffffffff;
      }
      local_30 = local_30 + 1;
      local_38 = local_38 + (long)(int)local_8[1] * 4;
    }
    if ((-1 < (int)local_44) &&
       (sVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::size(local_28),
       (ulong)local_48 < sVar4 - (long)(int)local_44)) {
      local_4c = local_44;
      sVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::size(local_28);
      local_48 = (int)sVar4 - local_44;
    }
    local_8[4] = local_48;
    local_8[5] = local_4c;
    local_8[2] = local_40;
    local_8[3] = local_3c;
    if (local_3c != *(uint *)&local_18[0xe]._M_node) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
                         "llama_kv_cache_view_update",(ulong)*(uint *)&local_18[0xe]._M_node,
                         (ulong)local_3c);
    }
  }
  return;
}

Assistant:

void llama_kv_cache_view_update(llama_kv_cache_view * view, const llama_kv_cache * kv) {
    // TODO: rework this in the future, for now quick hack
    const llama_kv_cache_unified * kvu = dynamic_cast<const llama_kv_cache_unified *>(kv);
    if (kvu == nullptr) {
        LLAMA_LOG_ERROR("%s: the kv_cache_view currently works only with llama_kv_cache_unified\n", __func__);
        return;
    }

    if (uint32_t(view->n_cells) < kvu->size || view->cells == nullptr) {
        view->n_cells = int32_t(kvu->size);
        void * p = realloc(view->cells, sizeof(llama_kv_cache_view_cell) * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells");
        view->cells = (llama_kv_cache_view_cell *)p;
        p = realloc(view->cells_sequences, sizeof(llama_seq_id) * view->n_seq_max * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells sequences");
        view->cells_sequences = (llama_seq_id *)p;
    }

    const std::vector<llama_kv_cell> & kv_cells = kvu->cells;
    llama_kv_cache_view_cell * c_curr = view->cells;
    llama_seq_id * cs_curr = view->cells_sequences;
    int32_t used_cells = 0;
    int32_t token_count = 0;
    int32_t curr_contig_idx = -1;
    uint32_t max_contig = 0;
    int32_t max_contig_idx = -1;

    for (int32_t i = 0; i < int32_t(kvu->size); i++, c_curr++, cs_curr += view->n_seq_max) {
        const size_t curr_size = kv_cells[i].seq_id.size();
        token_count += curr_size;
        c_curr->pos = kv_cells[i].pos + kv_cells[i].delta;

        if (curr_size > 0) {
            if (curr_contig_idx >= 0 && uint32_t(i - curr_contig_idx) > max_contig) {
                max_contig = i - curr_contig_idx;
                max_contig_idx = curr_contig_idx;
            }
            curr_contig_idx = -1;
        } else if (curr_contig_idx < 0) {
            curr_contig_idx = i;
        }

        int seq_idx = 0;
        for (const llama_seq_id it : kv_cells[i].seq_id) {
            if (seq_idx >= view->n_seq_max) {
                break;
            }
            cs_curr[seq_idx] = it;
            seq_idx++;
        }
        if (seq_idx != 0) {
            used_cells++;
        }
        for (; seq_idx < view->n_seq_max; seq_idx++) {
            cs_curr[seq_idx] = -1;
        }
    }
    if (curr_contig_idx >= 0 && kv_cells.size() - curr_contig_idx > max_contig) {
        max_contig_idx = curr_contig_idx;
        max_contig = kv_cells.size() - curr_contig_idx;
    }
    view->max_contiguous = max_contig;
    view->max_contiguous_idx = max_contig_idx;
    view->token_count = token_count;
    view->used_cells = used_cells;
    if (uint32_t(used_cells) != kvu->used) {
        LLAMA_LOG_ERROR("%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
            __func__, kvu->used, used_cells);
    }
}